

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  byte bVar1;
  uint3 uVar2;
  _Bool _Var3;
  bool bVar4;
  uint uVar5;
  CURLcode CVar6;
  CURLUcode CVar7;
  CURLUcode CVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  Curl_handler *pCVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  byte *pbVar16;
  size_t buflen;
  long lVar17;
  size_t olen;
  ulong uVar18;
  Curl_URL *pCVar19;
  char **optionsp;
  CURLUcode CVar20;
  size_t sVar21;
  byte *first;
  char cVar22;
  byte bVar23;
  dynbuf host;
  char *passwdp;
  CURLU tmpurl;
  dynbuf enc;
  char schemebuf [41];
  int *local_138;
  dynbuf local_128;
  char *local_108;
  char *local_100;
  Curl_URL local_f8;
  dynbuf local_98;
  size_t local_70;
  int local_68;
  char local_64;
  
  bVar23 = 0;
  local_f8.query = (char *)0x0;
  local_f8.fragment = (char *)0x0;
  local_f8.port = (char *)0x0;
  local_f8.path = (char *)0x0;
  local_f8.host = (char *)0x0;
  local_f8.zoneid = (char *)0x0;
  local_f8.password = (char *)0x0;
  local_f8.options = (char *)0x0;
  local_f8.scheme = (char *)0x0;
  local_f8.user = (char *)0x0;
  local_f8.portnum = 0;
  Curl_dyn_init(&local_128,8000000);
  pcVar10 = (char *)strlen(url);
  CVar8 = CURLUE_MALFORMED_INPUT;
  if (pcVar10 < " cmStateSnapshot &)") {
    uVar18 = (ulong)flags;
    sVar11 = Curl_is_absolute_url(url,(char *)&local_68,buflen,(flags & 0x204) != 0);
    if (sVar11 == 0) {
      CVar20 = CURLUE_OK;
      if ((flags & 0x204) == 0) {
        CVar20 = CURLUE_BAD_SCHEME;
        local_138 = (int *)0x0;
        pbVar16 = (byte *)0x0;
      }
      else {
        local_138 = (int *)0x0;
        if ((flags & 4) != 0) {
          local_138 = (int *)0x803597;
        }
LAB_005fac86:
        uVar18 = 0;
        while ((0x3f < (ulong)((byte *)url)[uVar18] ||
               ((0x8000800800000001U >> ((ulong)((byte *)url)[uVar18] & 0x3f) & 1) == 0))) {
          uVar18 = uVar18 + 1;
        }
        pbVar16 = (byte *)url;
        if (uVar18 == 0) {
          if ((flags >> 10 & 1) != 0) goto LAB_005face6;
          CVar20 = CURLUE_NO_HOST;
        }
        else {
          CVar6 = Curl_dyn_addn(&local_128,url,uVar18);
          if (CVar6 == CURLE_OK) {
LAB_005face6:
            pbVar16 = (byte *)url + uVar18;
            if ((local_138 == (int *)0x0) ||
               (local_f8.scheme = (*Curl_cstrdup)((char *)local_138),
               (int *)local_f8.scheme != (int *)0x0)) {
              _Var3 = false;
            }
            else {
              _Var3 = true;
              CVar20 = CURLUE_OUT_OF_MEMORY;
            }
            goto LAB_005fae05;
          }
          CVar20 = CURLUE_OUT_OF_MEMORY;
        }
      }
      _Var3 = true;
LAB_005fae05:
      CVar7 = (CURLUcode)uVar18;
      CVar8 = CVar20;
      if (_Var3 != true) {
        if (_Var3 != false) goto LAB_005fb2a9;
LAB_005fae1c:
        pcVar10 = strchr((char *)pbVar16,0x23);
        if (pcVar10 == (char *)0x0) {
          sVar13 = 0;
        }
        else {
          sVar13 = strlen(pcVar10);
          if (1 < sVar13) {
            local_f8.fragment = (char *)Curl_memdup(pcVar10 + 1,sVar13);
            if (local_f8.fragment == (char *)0x0) goto LAB_005fb153;
            _Var3 = junkscan(local_f8.fragment,flags);
            CVar8 = CURLUE_BAD_FRAGMENT;
            if (_Var3) goto LAB_005fb295;
          }
        }
        pcVar14 = strchr((char *)pbVar16,0x3f);
        cVar22 = (char)flags;
        if ((pcVar14 == (char *)0x0) || (pcVar10 != (char *)0x0 && pcVar10 <= pcVar14)) {
          sVar15 = strlen((char *)pbVar16);
          sVar21 = sVar15 - sVar13;
        }
        else {
          local_70 = strlen(pcVar14);
          uVar18 = local_70 - sVar13;
          sVar13 = strlen((char *)pbVar16);
          if (uVar18 < 2) {
            local_f8.query = (*Curl_cstrdup)("");
            if (local_f8.query != (char *)0x0) goto LAB_005fb000;
LAB_005faf5d:
            bVar4 = true;
            CVar7 = CURLUE_OUT_OF_MEMORY;
          }
          else {
            if (cVar22 < '\0') {
              Curl_dyn_init(&local_98,8000000);
              CVar8 = urlencode_str(&local_98,pcVar14 + 1,uVar18 - 1,true,true);
              if (CVar8 == CURLUE_OK) {
                local_f8.query = Curl_dyn_ptr(&local_98);
              }
              else {
                CVar20 = CURLUE_OUT_OF_MEMORY;
              }
              bVar4 = CVar8 != CURLUE_OK;
              CVar7 = CVar20;
              if (CVar8 != CURLUE_OK) goto LAB_005fb009;
            }
            else {
              local_f8.query = (char *)Curl_memdup(pcVar14 + 1,uVar18);
              if (local_f8.query == (char *)0x0) goto LAB_005faf5d;
              local_f8.query[uVar18 - 1] = '\0';
            }
            _Var3 = junkscan(local_f8.query,flags);
            if (_Var3) {
              bVar4 = true;
              CVar7 = CURLUE_BAD_QUERY;
            }
            else {
LAB_005fb000:
              bVar4 = false;
              CVar7 = CVar20;
            }
          }
LAB_005fb009:
          if (bVar4) {
            CVar8 = CVar7;
            if (!bVar4) goto LAB_005fb2a9;
            goto LAB_005fb295;
          }
          sVar21 = sVar13 - local_70;
          CVar20 = CVar7;
        }
        if (sVar21 == 0) {
          sVar21 = 0;
        }
        else if (cVar22 < '\0') {
          Curl_dyn_init(&local_98,8000000);
          CVar7 = urlencode_str(&local_98,(char *)pbVar16,sVar21,true,false);
          CVar8 = CURLUE_OUT_OF_MEMORY;
          if (CVar7 != CURLUE_OK) goto LAB_005fb295;
          sVar21 = Curl_dyn_len(&local_98);
          pbVar16 = (byte *)Curl_dyn_ptr(&local_98);
          local_f8.path = (char *)pbVar16;
        }
        if (sVar21 != 0) {
          if ((byte *)local_f8.path == (byte *)0x0) {
            pbVar16 = (byte *)Curl_memdup(pbVar16,sVar21 + 1);
            local_f8.path = (char *)pbVar16;
            if (pbVar16 == (byte *)0x0) goto LAB_005fb153;
LAB_005fb0ef:
            local_f8.path[sVar21] = 0;
          }
          else if (cVar22 < '\0') goto LAB_005fb0ef;
          _Var3 = junkscan(local_f8.path,flags);
          CVar8 = CURLUE_BAD_PATH;
          if (_Var3) goto LAB_005fb295;
          if ((flags & 0x10) == 0) {
            pbVar16 = (byte *)dedotdotify((char *)pbVar16,sVar21);
            if (pbVar16 == (byte *)0x0) {
              CVar8 = CURLUE_OUT_OF_MEMORY;
              goto LAB_005fb295;
            }
            (*Curl_cfree)(local_f8.path);
            local_f8.path = (char *)pbVar16;
          }
        }
        sVar21 = Curl_dyn_len(&local_128);
        if (sVar21 == 0) {
          CVar7 = CVar20;
          if ((flags >> 10 & 1) != 0) {
            CVar6 = Curl_dyn_add(&local_128,"");
            CVar8 = CURLUE_OUT_OF_MEMORY;
            if (CVar6 != CURLE_OK) goto LAB_005fb295;
          }
        }
        else {
          local_98.bufr = (char *)0x0;
          local_100 = (char *)0x0;
          CVar8 = CURLUE_OK;
          local_108 = (char *)0x0;
          pcVar10 = Curl_dyn_ptr(&local_128);
          pcVar14 = strchr(pcVar10,0x40);
          if (pcVar14 == (char *)0x0) {
LAB_005fb31f:
            (*Curl_cfree)(local_98.bufr);
            (*Curl_cfree)(local_100);
            (*Curl_cfree)(local_108);
            local_f8.user = (char *)0x0;
            local_f8.password = (char *)0x0;
            local_f8.options = (char *)0x0;
          }
          else {
            if ((int *)local_f8.scheme == (int *)0x0) {
              pCVar12 = (Curl_handler *)0x0;
            }
            else {
              pCVar12 = Curl_builtin_scheme(local_f8.scheme,0xffffffffffffffff);
            }
            if ((pCVar12 == (Curl_handler *)0x0) || ((pCVar12->flags & 0x400) == 0)) {
              optionsp = (char **)0x0;
            }
            else {
              optionsp = &local_108;
            }
            CVar6 = Curl_parse_login_details
                              (pcVar10,(size_t)(pcVar14 + 1 + ~(ulong)pcVar10),&local_98.bufr,
                               &local_100,optionsp);
            pcVar10 = local_98.bufr;
            if (CVar6 != CURLE_OK) {
              CVar8 = CURLUE_BAD_LOGIN;
              goto LAB_005fb31f;
            }
            if (local_98.bufr != (char *)0x0) {
              CVar8 = CURLUE_USER_NOT_ALLOWED;
              if ((flags & 0x20) == 0) {
                _Var3 = junkscan(local_98.bufr,flags);
                CVar8 = CURLUE_BAD_USER;
                if (!_Var3) {
                  local_f8.user = pcVar10;
                  goto LAB_005fb3de;
                }
              }
              goto LAB_005fb31f;
            }
LAB_005fb3de:
            pcVar10 = local_100;
            if (local_100 != (char *)0x0) {
              _Var3 = junkscan(local_100,flags);
              CVar8 = CURLUE_BAD_PASSWORD;
              if (_Var3) goto LAB_005fb31f;
              local_f8.password = pcVar10;
            }
            pcVar10 = local_108;
            if (local_108 != (char *)0x0) {
              _Var3 = junkscan(local_108,flags);
              CVar8 = CURLUE_BAD_LOGIN;
              if (_Var3) goto LAB_005fb31f;
              local_f8.options = pcVar10;
            }
            sVar13 = strlen(pcVar14 + 1);
            CVar6 = Curl_dyn_tail(&local_128,sVar13);
            CVar8 = CURLUE_OUT_OF_MEMORY;
            if (CVar6 == CURLE_OK) {
              CVar8 = CURLUE_OK;
            }
          }
          if (CVar8 == CURLUE_OK) {
            CVar8 = Curl_parse_port(&local_f8,&local_128,sVar11 != 0);
          }
          if (CVar8 == CURLUE_OK) {
            pcVar10 = Curl_dyn_ptr(&local_128);
            _Var3 = junkscan(pcVar10,flags);
            if (_Var3) {
              CVar8 = CURLUE_BAD_HOSTNAME;
              goto LAB_005fb4db;
            }
            pcVar10 = Curl_dyn_ptr(&local_128);
            _Var3 = ipv4_normalize(pcVar10,(char *)&local_98,olen);
            if (_Var3) {
              Curl_dyn_reset(&local_128);
              CVar6 = Curl_dyn_add(&local_128,(char *)&local_98);
              if (CVar6 != CURLE_OK) {
                CVar8 = CURLUE_OUT_OF_MEMORY;
                goto LAB_005fb4db;
              }
            }
            else {
              CVar8 = decode_host(&local_128);
              if (CVar8 == CURLUE_OK) {
                pcVar10 = Curl_dyn_ptr(&local_128);
                sVar11 = Curl_dyn_len(&local_128);
                CVar8 = hostname_check(&local_f8,pcVar10,sVar11);
              }
              if (CVar8 != CURLUE_OK) goto LAB_005fb4db;
            }
            CVar8 = CURLUE_OK;
            bVar4 = true;
            if (((flags >> 9 & 1) != 0) && (local_138 == (int *)0x0)) {
              pcVar10 = Curl_dyn_ptr(&local_128);
              iVar9 = curl_strnequal(pcVar10,"ftp.",4);
              if (iVar9 == 0) {
                iVar9 = curl_strnequal(pcVar10,"dict.",5);
                if (iVar9 == 0) {
                  iVar9 = curl_strnequal(pcVar10,"ldap.",5);
                  if (iVar9 == 0) {
                    iVar9 = curl_strnequal(pcVar10,"imap.",5);
                    if (iVar9 == 0) {
                      iVar9 = curl_strnequal(pcVar10,"smtp.",5);
                      if (iVar9 == 0) {
                        iVar9 = curl_strnequal(pcVar10,"pop3.",5);
                        pcVar10 = "pop3";
                        if (iVar9 == 0) {
                          pcVar10 = "http";
                        }
                      }
                      else {
                        pcVar10 = "smtp";
                      }
                    }
                    else {
                      pcVar10 = "imap";
                    }
                  }
                  else {
                    pcVar10 = "ldap";
                  }
                }
                else {
                  pcVar10 = "dict";
                }
              }
              else {
                pcVar10 = "ftp";
              }
              local_f8.scheme = (*Curl_cstrdup)(pcVar10);
              bVar4 = (int *)local_f8.scheme != (int *)0x0;
              CVar8 = CURLUE_OUT_OF_MEMORY;
              if (bVar4) {
                CVar8 = CURLUE_OK;
              }
            }
          }
          else {
LAB_005fb4db:
            bVar4 = false;
          }
          CVar7 = CVar8;
          if (!bVar4) goto LAB_005fb295;
        }
        local_f8.host = Curl_dyn_ptr(&local_128);
        goto LAB_005fb2a9;
      }
    }
    else {
      if (local_64 != '\0' || local_68 != 0x656c6966) {
        pcVar10 = url + sVar11 + 1;
        uVar2 = (uint3)(flags >> 8);
        if (pcVar10 == (char *)0x0) {
          uVar18 = CONCAT71((uint7)uVar2,1);
          pbVar16 = (byte *)0x0;
        }
        else {
          uVar5 = ~(uint)sVar11 - (int)url;
          pbVar16 = (byte *)0x0;
          lVar17 = 0;
          do {
            if ((pcVar10[lVar17] != '/') || (3 < (uint)lVar17)) {
              pbVar16 = (byte *)(pcVar10 + lVar17);
              uVar5 = (uint)lVar17;
              break;
            }
            lVar17 = lVar17 + 1;
          } while (pcVar10 + lVar17 != (char *)0x0);
          uVar18 = (ulong)CONCAT31(uVar2,uVar5 - 4 < 0xfffffffd);
        }
        local_138 = &local_68;
        pCVar12 = Curl_builtin_scheme((char *)local_138,0xffffffffffffffff);
        bVar4 = false;
        _Var3 = true;
        CVar20 = CURLUE_BAD_SLASHES;
        if ((flags & 8) == 0 && pCVar12 == (Curl_handler *)0x0) {
          CVar20 = CURLUE_UNSUPPORTED_SCHEME;
          bVar4 = false;
        }
        else if ((char)uVar18 == '\0') {
          _Var3 = junkscan((char *)&local_68,flags);
          CVar20 = CURLUE_BAD_SCHEME;
          if (!_Var3) {
            CVar20 = CURLUE_OK;
          }
          bVar4 = !_Var3;
        }
        url = (char *)pbVar16;
        if (bVar4) goto LAB_005fac86;
        goto LAB_005fae05;
      }
      if (pcVar10 < (char *)0x7) {
LAB_005fabe0:
        CVar8 = CURLUE_BAD_FILE_URL;
        goto LAB_005fb295;
      }
      local_138 = (int *)(*Curl_cstrdup)("file");
      local_f8.scheme = (char *)local_138;
      if (local_138 != (int *)0x0) {
        pbVar16 = (byte *)(url + 5);
        if ((*pbVar16 == 0x2f) && (url[6] == '/')) {
          first = (byte *)(url + 7);
          bVar4 = true;
          CVar20 = CURLUE_OK;
          if ((url[7] != 0x2f) &&
             (((0x19 < (byte)((url[7] & 0xdfU) + 0xbf) || ((url[8] != '|' && (url[8] != ':')))) ||
              ((cVar22 = url[9], cVar22 != '\0' && ((cVar22 != '/' && (cVar22 != '\\')))))))) {
            iVar9 = curl_strnequal((char *)first,"localhost/",10);
            if ((iVar9 == 0) && (iVar9 = curl_strnequal((char *)first,"127.0.0.1/",10), iVar9 == 0))
            {
              CVar20 = CURLUE_BAD_FILE_URL;
              bVar4 = false;
              first = pbVar16;
            }
            else {
              CVar20 = CURLUE_OK;
              first = (byte *)(url + 0x10);
            }
          }
          pbVar16 = first;
          CVar8 = CVar20;
          if (!bVar4) goto LAB_005fb295;
        }
        else {
          CVar20 = CURLUE_OK;
        }
        Curl_dyn_reset(&local_128);
        if ((((*pbVar16 == 0x2f) && ((byte)((pbVar16[1] & 0xdf) + 0xbf) < 0x1a)) &&
            ((pbVar16[2] == 0x7c || (pbVar16[2] == 0x3a)))) &&
           (((bVar1 = pbVar16[3], bVar1 == 0 || (bVar1 == 0x2f)) || (bVar1 == 0x5c))))
        goto LAB_005fabe0;
        if (((byte)((*pbVar16 & 0xdf) + 0xbf) < 0x1a) &&
           ((pbVar16[1] == 0x7c || (pbVar16[1] == 0x3a)))) {
          bVar1 = pbVar16[2];
          if ((bVar1 == 0) || (bVar1 == 0x2f)) goto LAB_005fabe0;
          CVar8 = CURLUE_BAD_FILE_URL;
          if (bVar1 == 0x5c) goto LAB_005fb295;
        }
        goto LAB_005fae1c;
      }
LAB_005fb153:
      CVar8 = CURLUE_OUT_OF_MEMORY;
    }
  }
LAB_005fb295:
  CVar7 = CVar8;
  Curl_dyn_free(&local_128);
  free_urlhandle(&local_f8);
LAB_005fb2a9:
  if (CVar7 == CURLUE_OK) {
    free_urlhandle(u);
    pCVar19 = &local_f8;
    for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
      u->scheme = pCVar19->scheme;
      pCVar19 = (Curl_URL *)((long)pCVar19 + ((ulong)bVar23 * -2 + 1) * 8);
      u = (CURLU *)((long)u + (ulong)bVar23 * -0x10 + 8);
    }
  }
  return CVar7;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}